

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void __thiscall EthBasePort::ProcessExtraData(EthBasePort *this,uchar *packet)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined8 in_RDX;
  undefined1 auVar7 [14];
  undefined1 auVar8 [16];
  
  (this->FpgaStatus).FwBusReset = (bool)(*packet & 1);
  (this->FpgaStatus).FwPacketDropped = (bool)(*packet >> 1 & 1);
  (this->FpgaStatus).EthInternalError = (bool)(*packet >> 2 & 1);
  (this->FpgaStatus).EthSummaryError = (bool)(*packet >> 3 & 1);
  bVar1 = *packet;
  (this->FpgaStatus).noForwardFlag = (bool)(bVar1 >> 4 & 1);
  (this->FpgaStatus).srcPort = *packet >> 5 & 3;
  (this->FpgaStatus).numStateInvalid = (uint)packet[2];
  (this->FpgaStatus).numPacketError = (uint)packet[3];
  bVar2 = packet[1];
  uVar3 = *(uint *)(packet + 4);
  auVar8 = psllw(ZEXT416(uVar3),8);
  auVar7 = auVar8._0_14_ | ZEXT414(CONCAT22((ushort)(uVar3 >> 0x18),(ushort)uVar3 >> 8));
  auVar4._10_2_ = 0;
  auVar4._0_10_ = auVar7._0_10_;
  auVar4._12_2_ = auVar7._6_2_;
  auVar5._8_2_ = auVar7._4_2_;
  auVar5._0_8_ = auVar7._0_8_;
  auVar5._10_4_ = auVar4._10_4_;
  auVar6._6_8_ = 0;
  auVar6._0_6_ = auVar5._8_6_;
  auVar8._0_8_ = (double)auVar7._0_2_;
  auVar8._8_8_ = (double)(int)CONCAT82(SUB148(auVar6 << 0x40,6),auVar7._2_2_);
  auVar8 = divpd(auVar8,_DAT_00123570);
  this->FPGA_RecvTime = (double)auVar8._0_8_;
  this->FPGA_TotalTime = (double)auVar8._8_8_;
  (this->super_BasePort).newFwBusGeneration = (uint)bVar2;
  if (((this->super_BasePort).FwBusGeneration != (uint)bVar2) && ((bVar1 >> 4 & 1) == 0)) {
    UNRECOVERED_JUMPTABLE = (this->super_BasePort)._vptr_BasePort[0x30];
    (*UNRECOVERED_JUMPTABLE)(this,(ulong)bVar2,in_RDX,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void EthBasePort::ProcessExtraData(const unsigned char *packet)
{
    FpgaStatus.FwBusReset = (packet[0]&FwBusReset);
    FpgaStatus.FwPacketDropped = (packet[0]&FwPacketDropped);
    FpgaStatus.EthInternalError = (packet[0]&EthInternalError);
    FpgaStatus.EthSummaryError = (packet[0]&EthSummaryError);
    FpgaStatus.noForwardFlag = (packet[0]&noForwardFlag);
    FpgaStatus.srcPort = (packet[0]&srcPortMask)>>srcPortShift;
    FpgaStatus.numStateInvalid = packet[2];
    FpgaStatus.numPacketError = packet[3];
    unsigned int FwBusGeneration_FPGA = packet[1];

    const double FPGA_sysclk_MHz = 49.152;      /* FPGA sysclk in MHz (from AmpIO.cpp) */
    const unsigned short *packetW = reinterpret_cast<const unsigned short *>(packet);
    FPGA_RecvTime = bswap_16(packetW[2])/(FPGA_sysclk_MHz*1.0e6);
    FPGA_TotalTime = bswap_16(packetW[3])/(FPGA_sysclk_MHz*1.0e6);

    newFwBusGeneration = FwBusGeneration_FPGA;
    if ((FwBusGeneration_FPGA != FwBusGeneration) && !FpgaStatus.noForwardFlag)
        OnFwBusReset(FwBusGeneration_FPGA);
}